

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O2

int displayMessage(char *msg_buffer)

{
  char cVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  undefined8 in_RAX;
  size_t sVar5;
  int iVar6;
  char *c;
  char *__dest;
  int iVar7;
  int iVar8;
  undefined8 uStack_40;
  undefined8 local_38;
  int width;
  int line_count;
  
  uStack_40 = 0x120be9;
  local_38 = in_RAX;
  sVar5 = strlen(msg_buffer);
  lVar3 = -(sVar5 + 0x2f & 0xfffffffffffffff0);
  __dest = (char *)((long)&local_38 + lVar3);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x120c05;
  strcpy(__dest,msg_buffer);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x15;
  uVar2 = *(undefined8 *)((long)&uStack_40 + lVar3);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x120c25;
  lineWrapString(__dest,(int)uVar2,"",(int *)&local_38,(int *)((long)&local_38 + 4));
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x120c2a;
  drawMap();
  iVar4 = (int)local_38;
  iVar8 = local_38._4_4_;
  iVar6 = local_38._4_4_ * 6;
  iVar7 = (int)local_38 * -4 + 0x80 >> 1;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x40;
  iVar8 = (int)*(undefined8 *)((long)&uStack_40 + lVar3) + iVar8 * -6 >> 1;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x120c6c;
  fillBox(iVar7 + -2,iVar8 + -2,iVar4 * 4 + 4,iVar6 + 5,0xff);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x120c8e;
  fillBox(iVar7 + -1,iVar8 + -1,(int)local_38 * 4 + 2,local_38._4_4_ * 6 + 2,'\0');
  iVar4 = iVar7;
  do {
    cVar1 = *__dest;
    if (cVar1 == '\n') {
      iVar8 = iVar8 + 6;
      iVar4 = iVar7;
    }
    else {
      if (cVar1 == '\0') {
        *(undefined8 *)((long)&uStack_40 + lVar3) = 0x120cc2;
        refreshDisplay();
        *(undefined8 *)((long)&uStack_40 + lVar3) = 0x120cc7;
        iVar4 = md_readchar();
        *(undefined8 *)((long)&uStack_40 + lVar3) = 0x120cce;
        refreshMap();
        return iVar4;
      }
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x120cab;
      drawChar(iVar4,iVar8,(int)cVar1);
      iVar4 = iVar4 + 4;
    }
    __dest = __dest + 1;
  } while( true );
}

Assistant:

int displayMessage(const char* msg_buffer)
{
    char buffer[strlen(msg_buffer) + 32];
    strcpy(buffer, msg_buffer);
    
    int max_line_width = (DISPLAY_WIDTH * 2 / 3) / 4;
    int width, line_count;
    lineWrapString(buffer, max_line_width, "", &width, &line_count);
    
    drawMap();
    int x = (DISPLAY_WIDTH - width * 4) / 2;
    int y = (DISPLAY_HEIGHT - line_count * 6) / 2;
    int sx = x;
    fillBox(x - 2, y - 2, width * 4 + 4, line_count * 6 + 5, 255);
    fillBox(x - 1, y - 1, width * 4 + 2, line_count * 6 + 2, 0);
    for(const char* c=buffer; *c; c++)
    {
        if (*c == '\n')
        {
            x = sx;
            y += 6;
        }else{
            drawChar(x, y, *c);
            x += 4;
        }
    }
    
    refreshDisplay();
    int ch = md_readchar();
    refreshMap();
    return ch;
}